

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_seeking.c
# Opt level: O0

int check_rsi_seek(test_state *state)

{
  int iVar1;
  uchar *local_28;
  uchar *tmp;
  int size;
  int status;
  test_state *state_local;
  
  iVar1 = state->bytes_per_sample;
  for (local_28 = state->ubuf; local_28 < state->ubuf + state->buf_len;
      local_28 = local_28 + (state->bytes_per_sample << 1)) {
    (*state->out)(local_28,state->xmax - ((long)state->ubuf - (long)local_28) % 0x40,iVar1);
    (*state->out)(local_28 + iVar1,state->xmin,iVar1);
  }
  printf("Checking seeking ... ");
  state_local._4_4_ = check_block_sizes_seek(state);
  if (state_local._4_4_ == 0) {
    printf("%s\n","\x1b[0;32mPASS\x1b[0m");
    state_local._4_4_ = 0;
  }
  return state_local._4_4_;
}

Assistant:

int check_rsi_seek(struct test_state *state)
{
    int status;
    int size = state->bytes_per_sample;

    for (unsigned char *tmp = state->ubuf;
         tmp < state->ubuf + state->buf_len;
         tmp += 2 * state->bytes_per_sample) {
        state->out(tmp, state->xmax - ((state->ubuf - tmp) % 64), size);
        state->out(tmp + size, state->xmin, size);
    }

    printf("Checking seeking ... ");
    status = check_block_sizes_seek(state);
    if (status)
        return status;

    printf ("%s\n", CHECK_PASS);
    return 0;
}